

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O0

void __thiscall Rml::ElementStyle::DirtyPropertiesWithUnits(ElementStyle *this,Units units)

{
  bool bVar1;
  Units units_00;
  ValueType VVar2;
  Property *property;
  PropertyId id;
  ValueType name_property_pair;
  PropertiesIterator it;
  Units units_local;
  ElementStyle *this_local;
  
  Iterate((PropertiesIterator *)&name_property_pair.second,this);
  while (bVar1 = PropertiesIterator::AtEnd((PropertiesIterator *)&name_property_pair.second),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    VVar2 = PropertiesIterator::operator*((PropertiesIterator *)&name_property_pair.second);
    name_property_pair._0_8_ = VVar2.second;
    units_00 = operator&(((Property *)name_property_pair._0_8_)->unit,units);
    bVar1 = Any(units_00);
    if (bVar1) {
      DirtyProperty(this,VVar2.first);
    }
    PropertiesIterator::operator++((PropertiesIterator *)&name_property_pair.second);
  }
  return;
}

Assistant:

void ElementStyle::DirtyPropertiesWithUnits(Units units)
{
	// Dirty all the properties of this element that use the unit(s).
	for (auto it = Iterate(); !it.AtEnd(); ++it)
	{
		auto name_property_pair = *it;
		PropertyId id = name_property_pair.first;
		const Property& property = name_property_pair.second;
		if (Any(property.unit & units))
			DirtyProperty(id);
	}
}